

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gls::BuiltinPrecisionTests::
InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
::operator()(InputLess<deqp::gls::BuiltinPrecisionTests::InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>_>
             *this,InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
                   *in1,
            InTuple<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
            *in2)

{
  Vector<float,_4> *vec1;
  Vector<float,_4> *vec2;
  bool bVar1;
  bool bVar2;
  InputLess<tcu::Vector<float,_4>_> local_2c;
  InputLess<tcu::Vector<float,_4>_> local_2b;
  InputLess<tcu::Vector<float,_4>_> local_2a;
  InputLess<tcu::Vector<float,_4>_> local_29;
  
  bVar1 = InputLess<tcu::Vector<float,_4>_>::operator()
                    (&local_2c,(Vector<float,_4> *)in1,(Vector<float,_4> *)in2);
  bVar2 = true;
  if (!bVar1) {
    bVar1 = InputLess<tcu::Vector<float,_4>_>::operator()
                      (&local_2b,(Vector<float,_4> *)in2,(Vector<float,_4> *)in1);
    if (!bVar1) {
      vec1 = &(in1->
              super_Tuple4<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>
              ).b;
      vec2 = &(in2->
              super_Tuple4<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>
              ).b;
      bVar1 = InputLess<tcu::Vector<float,_4>_>::operator()(&local_2a,vec1,vec2);
      if (bVar1) {
        return true;
      }
      bVar1 = InputLess<tcu::Vector<float,_4>_>::operator()(&local_29,vec2,vec1);
      if ((!bVar1) &&
         ((in1->
          super_Tuple4<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>
          ).c < (in2->
                super_Tuple4<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_deqp::gls::BuiltinPrecisionTests::Void>
                ).c)) {
        return true;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator() (const InTuple<In>& in1, const InTuple<In>& in2) const
	{
		if (inputLess(in1.a, in2.a))
			return true;
		if (inputLess(in2.a, in1.a))
			return false;
		if (inputLess(in1.b, in2.b))
			return true;
		if (inputLess(in2.b, in1.b))
			return false;
		if (inputLess(in1.c, in2.c))
			return true;
		if (inputLess(in2.c, in1.c))
			return false;
		if (inputLess(in1.d, in2.d))
			return true;
		return false;
	}